

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatoko.c
# Opt level: O2

satoko_t * Gia_ManSatokoFromDimacs(char *pFileName,satoko_opts_t *opts)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  satoko_t *s;
  byte *__ptr;
  Vec_Int_t *p;
  int iVar4;
  byte *pbVar5;
  byte *pbVar6;
  
  s = satoko_create();
  __ptr = (byte *)Extra_FileReadContents(pFileName);
  iVar4 = 0;
  p = Vec_IntAlloc((int)pFileName);
  pbVar6 = __ptr;
  do {
    bVar1 = *pbVar6;
    if ((bVar1 == 99) || (bVar1 == 0x70)) {
      pbVar6 = pbVar6 + -1;
      do {
        pbVar5 = pbVar6 + 1;
        pbVar6 = pbVar6 + 1;
      } while (*pbVar5 != 10);
    }
    else {
      if (bVar1 == 0) {
        free(__ptr);
        Vec_IntFree(p);
        return s;
      }
      while( true ) {
        pbVar5 = pbVar6 + 1;
        if (0x2d < bVar1) break;
        if ((0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) == 0) {
          if ((ulong)bVar1 == 0x2d) {
            bVar1 = *pbVar5;
            iVar3 = 1;
            pbVar6 = pbVar5;
            goto LAB_00625b3e;
          }
          break;
        }
        bVar1 = *pbVar5;
        pbVar6 = pbVar5;
      }
      iVar3 = 0;
LAB_00625b3e:
      iVar2 = atoi((char *)(pbVar6 + (bVar1 == 0x2b)));
      if (iVar2 == 0) {
        iVar3 = p->nSize;
        if (0 < iVar3) {
          satoko_setnvars(s,iVar4 + 1);
          iVar3 = satoko_add_clause(s,p->pArray,iVar3);
          if (iVar3 == 0) {
            satoko_destroy(s);
            Vec_IntFree(p);
            free(__ptr);
            return (satoko_t *)0x0;
          }
          p->nSize = 0;
        }
      }
      else {
        iVar2 = iVar2 + -1;
        if (iVar4 <= iVar2) {
          iVar4 = iVar2;
        }
        iVar3 = Abc_Var2Lit(iVar2,iVar3);
        Vec_IntPush(p,iVar3);
      }
      pbVar6 = pbVar6 + ((ulong)(bVar1 == 0x2b) - 1);
      do {
        pbVar5 = pbVar6 + 1;
        pbVar6 = pbVar6 + 1;
      } while ((byte)(*pbVar5 - 0x30) < 10);
    }
    pbVar6 = pbVar6 + 1;
  } while( true );
}

Assistant:

satoko_t * Gia_ManSatokoFromDimacs( char * pFileName, satoko_opts_t * opts )
{
    satoko_t * pSat = satoko_create();
    char * pBuffer = Extra_FileReadContents( pFileName );
    Vec_Int_t * vLits = Vec_IntAlloc( 100 );
    char * pTemp; int fComp, Var, VarMax = 0;
    for ( pTemp = pBuffer; *pTemp; pTemp++ )
    {
        if ( *pTemp == 'c' || *pTemp == 'p' ) 
        {
            while ( *pTemp != '\n' )
                pTemp++;
            continue;
        }
        while ( *pTemp == ' ' || *pTemp == '\t' || *pTemp == '\r' || *pTemp == '\n' )
            pTemp++;
        fComp = 0;
        if ( *pTemp == '-' )
            fComp = 1, pTemp++;
        if ( *pTemp == '+' )
            pTemp++;
        Var = atoi( pTemp );
        if ( Var == 0 ) {
            if ( Vec_IntSize(vLits) > 0 ) 
            {
                satoko_setnvars( pSat, VarMax+1 );
                if ( !satoko_add_clause( pSat, Vec_IntArray(vLits), Vec_IntSize(vLits) ) )
                {
                    satoko_destroy(pSat);
                    Vec_IntFree( vLits );
                    ABC_FREE( pBuffer );
                    return NULL;
                }
                Vec_IntClear( vLits );
            }
        }
        else 
        {
            Var--;
            VarMax = Abc_MaxInt( VarMax, Var );
            Vec_IntPush( vLits, Abc_Var2Lit(Var, fComp) );
        }
        while ( *pTemp >= '0' && *pTemp <= '9' )
            pTemp++;
    }
    ABC_FREE( pBuffer );
    Vec_IntFree( vLits );
    return pSat;
}